

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_misc.c
# Opt level: O2

void wrtsep(FILE *out,char fill,char *title,int nchar)

{
  size_t sVar1;
  char *__dest;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  
  sVar1 = strlen(title);
  uVar6 = (uint)sVar1;
  uVar8 = (ulong)(uint)nchar;
  if (nchar < (int)uVar6) {
    uVar8 = sVar1 & 0xffffffff;
  }
  iVar7 = (int)uVar8;
  if (iVar7 < 1) {
    return;
  }
  __dest = (char *)malloc((ulong)(iVar7 + 1));
  pcVar3 = __dest;
  if ((int)uVar6 < 1) {
    while (iVar7 = (int)uVar8, uVar8 = (ulong)(iVar7 - 1), iVar7 != 0) {
      *pcVar3 = fill;
      pcVar3 = pcVar3 + 1;
    }
  }
  else {
    uVar8 = (long)(int)(iVar7 - uVar6) / 2;
    iVar5 = (int)uVar8;
    lVar2 = 0;
    uVar4 = 0;
    if (0 < iVar5) {
      uVar4 = uVar8 & 0xffffffff;
    }
    for (; (int)uVar4 != (int)lVar2; lVar2 = lVar2 + 1) {
      __dest[lVar2] = fill;
    }
    __dest[lVar2] = '\0';
    strcat(__dest,title);
    pcVar3 = __dest + (ulong)(uVar6 & 0x7fffffff) + lVar2;
    for (iVar5 = iVar5 + uVar6; iVar5 < iVar7; iVar5 = iVar5 + 1) {
      *pcVar3 = fill;
      pcVar3 = pcVar3 + 1;
    }
  }
  *pcVar3 = '\0';
  if (out != (FILE *)0x0) {
    fprintf((FILE *)out,"%s\n",__dest);
  }
  if (_stdout == out) {
    fflush((FILE *)out);
  }
  free(__dest);
  return;
}

Assistant:

void wrtsep(FILE *out,char fill, char *title, int nchar)
/* print a line of char fill with string title in the middle */
{
    int ntitle; 
    char *line; 
    char *p;
    int first_end;
    int i = 0;

    ntitle = strlen(title); 
    if(ntitle > nchar) nchar = ntitle;
    if(nchar <= 0) return; 
    line = (char *)malloc((nchar+1)*sizeof(char)); 
    p = line;
    if(ntitle < 1) { 
        for (i=0; i < nchar; i++) {*p = fill; p++;}	
	*p = '\0';
    }
    else { 
	first_end = ( nchar - ntitle)/2; 
	for (i = 0; i < first_end; i++) { *p = fill; p++;}
	*p = '\0';
	strcat(line, title);
	p += ntitle;
        for( i = first_end + ntitle; i < nchar; i++) {*p = fill; p++;}
	*p = '\0';
    }
    if(out != NULL )fprintf(out,"%s\n",line);
    if(out == stdout )fflush(out);
    free (line);
    return ;
}